

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O0

void print_result(int f,priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                        *pr_queue)

{
  v_array<char> tag;
  bool bVar1;
  const_reference __p;
  ulong uVar2;
  void *__buf;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  int in_EDI;
  ssize_t t;
  ssize_t len;
  scored_example tmp_example;
  stringstream ss;
  char temp [30];
  priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
  *in_stack_fffffffffffffd40;
  stringstream *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  string *this;
  undefined8 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  string local_268 [32];
  ulong local_248;
  string local_240 [32];
  ulong local_220;
  char *local_218;
  char *pcStack_210;
  char *local_208;
  priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
  *ppStack_200;
  pair<float,_v_array<char>_> local_1e8;
  stringstream local_1c0 [16];
  ostream local_1b0;
  char local_38 [52];
  int local_4;
  
  if (-1 < in_EDI) {
    local_4 = in_EDI;
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::pair<float,_v_array<char>_>::pair<float,_v_array<char>,_true>
              ((pair<float,_v_array<char>_> *)0x2dea1e);
    while( true ) {
      bVar1 = std::
              priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
              ::empty((priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                       *)0x2dea2f);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __p = std::
            priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
            ::top((priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                   *)0x2dea51);
      std::pair<float,_v_array<char>_>::operator=(&local_1e8,__p);
      std::
      priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
      ::pop(in_stack_fffffffffffffd40);
      sprintf(local_38,"%f",SUB84((double)local_1e8.first,0));
      std::operator<<(&local_1b0,local_38);
      std::operator<<(&local_1b0,' ');
      local_208 = local_1e8.second.end_array;
      ppStack_200 = (priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                     *)local_1e8.second.erase_count;
      local_218 = local_1e8.second._begin;
      pcStack_210 = local_1e8.second._end;
      tag._end = (char *)in_stack_fffffffffffffd68;
      tag._begin = (char *)in_stack_fffffffffffffd60;
      tag.end_array = (char *)in_stack_fffffffffffffd70;
      tag.erase_count._0_4_ = in_stack_fffffffffffffd78;
      tag.erase_count._4_4_ = in_stack_fffffffffffffd7c;
      in_stack_fffffffffffffd40 =
           (priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
            *)local_1e8.second.erase_count;
      print_tag(in_stack_fffffffffffffd50,tag);
      std::operator<<(&local_1b0,' ');
      std::operator<<(&local_1b0,'\n');
    }
    std::operator<<(&local_1b0,'\n');
    std::__cxx11::stringstream::str();
    this = local_240;
    uVar2 = std::__cxx11::string::size();
    std::__cxx11::string::~string(this);
    local_220 = uVar2;
    std::__cxx11::stringstream::str();
    __buf = (void *)std::__cxx11::string::c_str();
    uVar2 = write(local_4,__buf,local_220 & 0xffffffff);
    std::__cxx11::string::~string(local_268);
    local_248 = uVar2;
    if (uVar2 != local_220) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return;
}

Assistant:

void print_result(int f, priority_queue<scored_example, vector<scored_example>, compare_scored_examples>& pr_queue)
{
  if (f >= 0)
  {
    char temp[30];
    std::stringstream ss;
    scored_example tmp_example;
    while (!pr_queue.empty())
    {
      tmp_example = pr_queue.top();
      pr_queue.pop();
      sprintf(temp, "%f", tmp_example.first);
      ss << temp;
      ss << ' ';
      print_tag(ss, tmp_example.second);
      ss << ' ';
      ss << '\n';
    }
    ss << '\n';
    ssize_t len = ss.str().size();
#ifdef _WIN32
    ssize_t t = _write(f, ss.str().c_str(), (unsigned int)len);
#else
    ssize_t t = write(f, ss.str().c_str(), (unsigned int)len);
#endif
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}